

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::cbtArcSegmentCollisionAlgorithm::processCollision
          (cbtArcSegmentCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  cbtPersistentManifold *this_00;
  cbtCollisionShape *pcVar17;
  cbtCollisionObject *pcVar18;
  cbtCollisionObject *pcVar19;
  cbtCollisionShape *pcVar20;
  undefined8 uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  int iVar25;
  long lVar26;
  cbtManifoldPoint *pt;
  cbtCollisionObjectWrapper *pcVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar50 [56];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_XMM18 [16];
  cbtVector3 cVar57;
  cbtVector3 local_P2;
  cbtVector3 normal_on_2;
  cbtVector3 pos2;
  undefined8 local_178;
  float local_108;
  undefined1 local_f8 [16];
  cbtVector3 local_b8;
  undefined1 local_a8 [16];
  double local_98;
  double local_90;
  cbtVector3 local_88;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar47 [56];
  
  auVar31 = in_ZMM17._0_16_;
  this_00 = this->m_manifoldPtr;
  if (this_00 == (cbtPersistentManifold *)0x0) {
    return;
  }
  pcVar27 = body1;
  if (this->m_isSwapped != false) {
    pcVar27 = body0;
    body0 = body1;
  }
  resultOut->m_manifoldPtr = this_00;
  iVar25 = this_00->m_cachedPoints;
  if (0 < iVar25) {
    pt = this_00->m_pointCache;
    lVar26 = 0;
    do {
      cbtPersistentManifold::clearUserCache(this_00,pt);
      auVar31 = in_ZMM17._0_16_;
      lVar26 = lVar26 + 1;
      iVar25 = this_00->m_cachedPoints;
      pt = pt + 1;
    } while (lVar26 < iVar25);
  }
  if (iVar25 != 0 && gContactEndedCallback != (ContactEndedCallback)0x0) {
    local_b8.m_floats._0_8_ = this_00;
    (*gContactEndedCallback)((cbtPersistentManifold **)&local_b8);
  }
  this_00->m_cachedPoints = 0;
  pcVar17 = body0->m_shape;
  if ((char)pcVar17[2].m_userIndex != '\0') {
    return;
  }
  pcVar18 = body0->m_collisionObject;
  pcVar19 = pcVar27->m_collisionObject;
  cVar1 = (pcVar18->m_worldTransform).m_basis.m_el[0].m_floats[2];
  cVar2 = (pcVar19->m_worldTransform).m_basis.m_el[0].m_floats[2];
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((pcVar18->m_worldTransform).m_basis.m_el[1].m_floats[2] *
                                          (pcVar19->m_worldTransform).m_basis.m_el[1].m_floats[2])),
                            ZEXT416((uint)cVar1),ZEXT416((uint)cVar2));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)(pcVar18->m_worldTransform).m_basis.m_el[2].
                                                  m_floats[2]),
                            ZEXT416((uint)(pcVar19->m_worldTransform).m_basis.m_el[2].m_floats[2]));
  auVar54._8_4_ = 0x7fffffff;
  auVar54._0_8_ = 0x7fffffff7fffffff;
  auVar54._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx512vl(auVar28,auVar54);
  if (auVar28._0_4_ < 0.99) {
    return;
  }
  pcVar20 = pcVar27->m_shape;
  fVar37 = (pcVar18->m_worldTransform).m_origin.m_floats[0];
  fVar38 = (pcVar19->m_worldTransform).m_origin.m_floats[0];
  fVar51 = (pcVar19->m_worldTransform).m_origin.m_floats[1];
  fVar52 = (pcVar19->m_worldTransform).m_origin.m_floats[2];
  fVar53 = (pcVar19->m_worldTransform).m_basis.m_el[1].m_floats[2];
  cVar3 = (pcVar19->m_worldTransform).m_basis.m_el[2].m_floats[2];
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * ((pcVar18->m_worldTransform).m_origin.m_floats
                                                     [1] - fVar51))),ZEXT416((uint)cVar2),
                            ZEXT416((uint)(fVar37 - fVar38)));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar3),
                            ZEXT416((uint)((pcVar18->m_worldTransform).m_origin.m_floats[2] - fVar52
                                          )));
  auVar32._8_4_ = 0x7fffffff;
  auVar32._0_8_ = 0x7fffffff7fffffff;
  auVar32._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx512vl(auVar28,auVar32);
  if (*(float *)&pcVar17[2].field_0x1c + *(float *)((long)&pcVar20[3]._vptr_cbtCollisionShape + 4) <
      auVar28._0_4_) {
    return;
  }
  cVar4 = (pcVar19->m_worldTransform).m_basis.m_el[2].m_floats[1];
  fVar35 = (pcVar19->m_worldTransform).m_basis.m_el[1].m_floats[1];
  cVar5 = (pcVar19->m_worldTransform).m_basis.m_el[0].m_floats[0];
  cVar6 = (pcVar19->m_worldTransform).m_basis.m_el[0].m_floats[1];
  cVar7 = (pcVar19->m_worldTransform).m_basis.m_el[2].m_floats[0];
  fVar36 = (pcVar19->m_worldTransform).m_basis.m_el[1].m_floats[0];
  uVar8 = *(uint *)((long)&pcVar17[2]._vptr_cbtCollisionShape + 4);
  fVar9 = (float)pcVar17[2].m_shapeType;
  fVar10 = (pcVar18->m_worldTransform).m_basis.m_el[0].m_floats[0];
  fVar11 = (pcVar18->m_worldTransform).m_basis.m_el[0].m_floats[1];
  auVar56 = ZEXT416((uint)fVar11);
  auVar28 = vxorps_avx512vl(auVar31,auVar31);
  fVar12 = (pcVar18->m_worldTransform).m_basis.m_el[1].m_floats[0];
  fVar13 = (pcVar18->m_worldTransform).m_basis.m_el[1].m_floats[1];
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar13)),ZEXT416(uVar8),ZEXT416((uint)fVar12));
  auVar54 = ZEXT416((uint)(pcVar18->m_worldTransform).m_basis.m_el[1].m_floats[2]);
  auVar29 = vfmadd231ss_avx512f(auVar31,auVar54,auVar28);
  fVar33 = (pcVar18->m_worldTransform).m_basis.m_el[2].m_floats[0];
  fVar34 = (pcVar18->m_worldTransform).m_basis.m_el[2].m_floats[1];
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar34)),ZEXT416(uVar8),ZEXT416((uint)fVar33));
  auVar55 = ZEXT416((uint)(pcVar18->m_worldTransform).m_basis.m_el[2].m_floats[2]);
  auVar30 = vfmadd231ss_avx512f(auVar31,auVar55,auVar28);
  fVar14 = (pcVar18->m_worldTransform).m_origin.m_floats[1];
  fVar15 = (pcVar18->m_worldTransform).m_origin.m_floats[2];
  auVar32 = ZEXT816(0) << 0x20;
  auVar31 = vmulss_avx512f(ZEXT416((uint)fVar11),auVar32);
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 + auVar31._0_4_)),ZEXT416((uint)cVar1),auVar32);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 + fVar13 * 0.0)),auVar32,auVar54);
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 + fVar34 * 0.0)),auVar32,auVar55);
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * auVar28._0_4_)),ZEXT416((uint)cVar5),auVar31);
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)cVar7),auVar54);
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * auVar28._0_4_)),ZEXT416((uint)cVar6),auVar31);
  auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)cVar4),auVar54);
  fVar33 = atan2f(auVar31._0_4_,auVar32._0_4_);
  auVar31 = vcvtss2sd_avx512f(in_XMM18,ZEXT416(*(uint *)&pcVar17[2].m_userPointer));
  local_90 = auVar31._0_8_;
  auVar31 = vcvtss2sd_avx512f(in_XMM18,ZEXT416(*(uint *)((long)&pcVar17[2].m_userPointer + 4)));
  local_98 = auVar31._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)((long)&pcVar20[2]._vptr_cbtCollisionShape + 4);
  fVar13 = *(float *)&pcVar20[2].field_0xc;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)((long)&pcVar20[2].m_userPointer + 4);
  auVar28 = vsubps_avx(auVar31,auVar55);
  auVar31 = vmovshdup_avx(auVar28);
  fVar12 = *(float *)&pcVar20[2].field_0x1c - fVar13;
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar31._0_4_ * auVar31._0_4_)),auVar28,auVar28);
  auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
  if (auVar54._0_4_ < 0.0) {
    uStack_70 = 0;
    uStack_6c = 0;
    local_a8 = auVar31;
    local_78 = fVar13;
    uStack_74 = *(undefined4 *)&pcVar20[2].m_userPointer;
    local_68 = auVar55;
    fVar34 = sqrtf(auVar54._0_4_);
    auVar55 = local_68;
    auVar31 = local_a8;
    fVar13 = local_78;
  }
  else {
    auVar54 = vsqrtss_avx(auVar54,auVar54);
    fVar34 = auVar54._0_4_;
  }
  if (fVar34 < 1e-30) {
    return;
  }
  auVar54 = vfmadd132ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)(fVar11 * fVar9)),ZEXT416(uVar8));
  auVar54 = vfmadd213ss_fma(ZEXT816(0),ZEXT416((uint)cVar1),auVar54);
  fVar51 = (auVar29._0_4_ + fVar14) - fVar51;
  fVar38 = (fVar37 + auVar54._0_4_) - fVar38;
  fVar52 = (auVar30._0_4_ + fVar15) - fVar52;
  auVar54 = vfmadd213ss_fma(ZEXT416((uint)cVar5),ZEXT416((uint)fVar38),
                            ZEXT416((uint)(fVar51 * fVar36)));
  auVar32 = vfmadd213ss_fma(ZEXT416((uint)cVar6),ZEXT416((uint)fVar38),
                            ZEXT416((uint)(fVar51 * fVar35)));
  auVar29 = vfmadd213ss_fma(ZEXT416((uint)cVar2),ZEXT416((uint)fVar38),
                            ZEXT416((uint)(fVar53 * fVar51)));
  auVar30 = vfmadd213ss_fma(ZEXT416((uint)cVar7),ZEXT416((uint)fVar52),auVar54);
  auVar32 = vfmadd213ss_fma(ZEXT416((uint)cVar4),ZEXT416((uint)fVar52),auVar32);
  auVar29 = vfmadd213ss_fma(ZEXT416((uint)cVar3),ZEXT416((uint)fVar52),auVar29);
  auVar54 = vmovshdup_avx(auVar55);
  local_108 = auVar29._0_4_;
  fVar51 = auVar32._0_4_;
  fVar52 = auVar30._0_4_;
  fVar53 = 1.0 / fVar34;
  fVar37 = auVar28._0_4_ * fVar53;
  fVar38 = auVar31._0_4_ * fVar53;
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)((fVar51 - auVar54._0_4_) * fVar38)),ZEXT416((uint)fVar37)
                            ,ZEXT416((uint)(fVar52 - auVar55._0_4_)));
  auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)(fVar12 * fVar53)),
                            ZEXT416((uint)(local_108 - fVar13)));
  fVar35 = auVar54._0_4_;
  if (fVar35 < 0.0) {
    return;
  }
  if (fVar34 < fVar35) {
    return;
  }
  uVar16 = *(ulong *)((long)&pcVar20[2]._vptr_cbtCollisionShape + 4);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar16;
  auVar54 = vmovshdup_avx(auVar29);
  auVar54 = vinsertps_avx(ZEXT416((uint)(fVar37 * fVar35 + (float)uVar16)),
                          ZEXT416((uint)(fVar38 * fVar35 + auVar54._0_4_)),0x10);
  local_b8.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar54,ZEXT416((uint)(fVar12 * fVar53 * fVar35 +
                                           *(float *)&pcVar20[2].field_0xc)),0x28);
  fVar37 = fVar52 - local_b8.m_floats[0];
  fVar38 = fVar51 - local_b8.m_floats[1];
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar38 * fVar38)),ZEXT416((uint)fVar37),
                            ZEXT416((uint)fVar37));
  fVar53 = auVar54._0_4_;
  if (fVar53 < 0.0) {
    local_a8 = auVar31;
    fVar35 = sqrtf(fVar53);
    auVar54 = ZEXT416((uint)fVar53);
    auVar31 = local_a8;
  }
  else {
    auVar32 = vsqrtss_avx(auVar54,auVar54);
    fVar35 = auVar32._0_4_;
  }
  auVar32 = vcvtss2sd_avx512f(auVar56,ZEXT416((uint)fVar33));
  fVar35 = 1.0 / fVar35;
  fVar53 = *(float *)&pcVar17[2].field_0xc;
  auVar31 = vfmsub213ss_fma(auVar28,ZEXT416((uint)fVar38),ZEXT416((uint)(fVar37 * auVar31._0_4_)));
  if (auVar54._0_4_ < 0.0) {
    fVar36 = sqrtf(auVar54._0_4_);
  }
  else {
    auVar28 = vsqrtss_avx(auVar54,auVar54);
    fVar36 = auVar28._0_4_;
  }
  dVar39 = auVar32._0_8_ + local_90;
  dVar40 = auVar32._0_8_ + local_98;
  fVar9 = fVar53 * fVar37 * fVar35;
  fVar10 = fVar53 * fVar38 * fVar35;
  fVar53 = fVar53 * fVar35 * 0.0;
  fVar36 = 1.0 / fVar36;
  if (auVar31._0_4_ <= 0.0) {
    local_f8 = vinsertps_avx(ZEXT416((uint)(fVar9 + fVar52)),ZEXT416((uint)(fVar10 + fVar51)),0x10);
    local_108 = local_108 + fVar53;
    auVar31 = vinsertps_avx(ZEXT416((uint)(fVar36 * -fVar37)),ZEXT416((uint)(fVar36 * -fVar38)),0x10
                           );
    fVar36 = fVar36 * -0.0;
  }
  else {
    local_f8 = vinsertps_avx(ZEXT416((uint)(fVar52 - fVar9)),ZEXT416((uint)(fVar51 - fVar10)),0x10);
    local_108 = local_108 - fVar53;
    auVar31 = vinsertps_avx(ZEXT416((uint)(fVar37 * fVar36)),ZEXT416((uint)(fVar38 * fVar36)),0x10);
    fVar36 = fVar36 * 0.0;
  }
  local_88.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar31,ZEXT416((uint)fVar36));
  fVar37 = atan2f(-local_88.m_floats[1],-local_88.m_floats[0]);
  auVar42._0_8_ = fmod(dVar39 + 1e-30,6.283185307179586);
  auVar42._8_56_ = extraout_var;
  uVar21 = vcmpsd_avx512f(auVar42._0_16_,ZEXT816(0) << 0x40,1);
  bVar22 = (bool)((byte)uVar21 & 1);
  auVar43._0_8_ = fmod(dVar40 + 1e-30,6.283185307179586);
  auVar43._8_56_ = extraout_var_00;
  uVar21 = vcmpsd_avx512f(auVar43._0_16_,ZEXT816(0),1);
  bVar23 = (bool)((byte)uVar21 & 1);
  auVar44._0_8_ = fmod((double)fVar37,6.283185307179586);
  auVar44._8_56_ = extraout_var_01;
  uVar21 = vcmpsd_avx512f(auVar44._0_16_,ZEXT816(0),1);
  bVar24 = (bool)((byte)uVar21 & 1);
  dVar39 = fmod((double)((ulong)bVar22 * (long)(auVar42._0_8_ + 6.283185307179586) +
                        (ulong)!bVar22 * (long)auVar42._0_8_),6.283185307179586);
  dVar40 = fmod((double)((ulong)bVar23 * (long)(auVar43._0_8_ + 6.283185307179586) +
                        (ulong)!bVar23 * (long)auVar43._0_8_),6.283185307179586);
  dVar41 = fmod((double)((ulong)bVar24 * (long)(auVar44._0_8_ + 6.283185307179586) +
                        (ulong)!bVar24 * (long)auVar44._0_8_),6.283185307179586);
  auVar50 = ZEXT856(0);
  if (dVar40 <= dVar39) {
    if (dVar41 < dVar40) {
      return;
    }
  }
  else if (dVar40 <= dVar41) goto LAB_00808278;
  if (dVar39 < dVar41) {
    return;
  }
LAB_00808278:
  auVar47 = extraout_var_02;
  cVar57 = cbtTransform::operator*(&pcVar19->m_worldTransform,&local_b8);
  auVar48._0_8_ = cVar57.m_floats._8_8_;
  auVar48._8_56_ = auVar50;
  auVar45._0_8_ = cVar57.m_floats._0_8_;
  auVar45._8_56_ = auVar47;
  local_40 = vunpcklpd_avx(auVar45._0_16_,auVar48._0_16_);
  auVar47 = ZEXT856(local_40._8_8_);
  cVar57 = ::operator*(&(pcVar19->m_worldTransform).m_basis,&local_88);
  auVar49._0_8_ = cVar57.m_floats._8_8_;
  auVar49._8_56_ = auVar50;
  auVar46._0_8_ = cVar57.m_floats._0_8_;
  auVar46._8_56_ = auVar47;
  local_50 = vunpcklpd_avx(auVar46._0_16_,auVar49._0_16_);
  auVar31 = vmovshdup_avx(local_f8);
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)((auVar31._0_4_ - local_b8.m_floats[1]) *
                                          local_88.m_floats[1])),
                            ZEXT416((uint)(local_f8._0_4_ - local_b8.m_floats[0])),
                            ZEXT416((uint)local_88.m_floats[0]));
  auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)(local_108 - local_b8.m_floats[2])),
                            ZEXT416((uint)local_88.m_floats[2]));
  auVar28._8_4_ = 0x7fffffff;
  auVar28._0_8_ = 0x7fffffff7fffffff;
  auVar28._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx512vl(auVar31,auVar28);
  fVar38 = auVar28._0_4_;
  (*pcVar17->_vptr_cbtCollisionShape[0xc])(pcVar17);
  fVar37 = fVar38;
  (*pcVar20->_vptr_cbtCollisionShape[0xc])(pcVar20);
  if (auVar28._0_4_ <= fVar37 + fVar38) {
    local_178 = auVar31._0_8_;
    (*(resultOut->super_Result)._vptr_Result[4])(local_178,resultOut,local_50,local_40);
    cbtManifoldResult::refreshContactPoints(resultOut);
  }
  return;
}

Assistant:

void cbtArcSegmentCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                       const cbtCollisionObjectWrapper* body1,
                                                       const cbtDispatcherInfo& dispatchInfo,
                                                       cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* arcObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* segmentObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    // only 1 contact per pair, avoid persistence
    resultOut->getPersistentManifold()->clearManifold();

    const cbt2DarcShape* arc = (cbt2DarcShape*)arcObjWrap->getCollisionShape();
    const cbt2DsegmentShape* segment = (cbt2DsegmentShape*)segmentObjWrap->getCollisionShape();

    // A concave arc (i.e.with outward volume, counterclockwise abscissa) will never collide with segments
    if (arc->get_counterclock())
        return;

    const cbtTransform& m44Tarc = arcObjWrap->getCollisionObject()->getWorldTransform();
    const cbtTransform& m44Tsegment = segmentObjWrap->getCollisionObject()->getWorldTransform();

    // Shapes on two planes that are not so parallel? no collisions!
    cbtVector3 Zarc = m44Tarc.getBasis().getColumn(2);
    cbtVector3 Zsegment = m44Tsegment.getBasis().getColumn(2);
    if (fabs(Zarc.dot(Zsegment)) < 0.99)  //***TODO*** threshold as setting
        return;

    // Shapes on two planes that are too far? no collisions!
    cbtVector3 diff = m44Tsegment.invXform(m44Tarc.getOrigin());
    if (fabs(diff.getZ()) > (arc->get_zthickness() + segment->get_zthickness()))
        return;

    // vectors of body 1 in body 2 csys:
    cbtVector3 local_arc_center = m44Tsegment.invXform(m44Tarc * cbtVector3(arc->get_X(), arc->get_Y(), 0));
    cbtVector3 local_arc_X = m44Tsegment.getBasis().transpose() * (m44Tarc.getBasis() * cbtVector3(1, 0, 0));
    double local_arc_rot = atan2(local_arc_X.getY(), local_arc_X.getX());
    double arc1_angle1 = local_arc_rot + arc->get_angle1();
    double arc1_angle2 = local_arc_rot + arc->get_angle2();

    cbtVector3 local_CS1 = local_arc_center - segment->get_P1();
    cbtVector3 local_seg_S2S1 = (segment->get_P2() - segment->get_P1());
    cbtScalar seg_length = local_seg_S2S1.length();
    if (seg_length < 1e-30)
        return;
    cbtVector3 local_seg_D = local_seg_S2S1 / seg_length;
    cbtScalar param = local_CS1.dot(local_seg_D);

    // contact out of segment extrema?
    if (param < 0)
        return;
    if (param > seg_length)
        return;

    cbtVector3 local_P2 = segment->get_P1() + local_seg_D * param;
    cbtVector3 local_CP2 = local_arc_center - local_P2;
    local_CP2.setZ(0);
    cbtVector3 local_R = local_CP2.normalized() * arc->get_radius();
    cbtVector3 local_P1;
    cbtVector3 local_N2;
    if (local_seg_S2S1.cross(local_CP2).getZ() > 0) {
        local_P1 = local_arc_center - local_R;
        local_N2 = local_CP2.normalized();
    } else {
        local_P1 = local_arc_center + local_R;
        local_N2 = -local_CP2.normalized();
    }

    double alpha = atan2(-local_N2.getY(), -local_N2.getX());

    // Discard points out of min-max angles

    // to always positive angles:
    arc1_angle1 = fmod(arc1_angle1 + 1e-30, CH_C_2PI);
    if (arc1_angle1 < 0)
        arc1_angle1 += CH_C_2PI;
    arc1_angle2 = fmod(arc1_angle2 + 1e-30, CH_C_2PI);
    if (arc1_angle2 < 0)
        arc1_angle2 += CH_C_2PI;
    alpha = fmod(alpha, CH_C_2PI);
    if (alpha < 0)
        alpha += CH_C_2PI;

    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);

    alpha = fmod(alpha, CH_C_2PI);

    bool inangle1 = false;

    if (arc1_angle1 < arc1_angle2) {
        if (alpha >= arc1_angle2 || alpha <= arc1_angle1)
            inangle1 = true;
    } else {
        if (alpha >= arc1_angle2 && alpha <= arc1_angle1)
            inangle1 = true;
    }

    if (!inangle1)
        return;

    // transform in absolute coords:
    // cbtVector3 pos1 = m44Tsegment * local_P1; // not needed
    cbtVector3 pos2 = m44Tsegment * local_P2;
    cbtVector3 normal_on_2 = m44Tsegment.getBasis() * local_N2;
    cbtScalar dist = local_N2.dot(local_P1 - local_P2);

    // too far or too interpenetrate? discard.
    if (fabs(dist) > (arc->getMargin() + segment->getMargin()))
        return;

    /// report a contact. internally this will be kept persistent, and contact reduction is done
    resultOut->addContactPoint(normal_on_2, pos2, dist);

    resultOut->refreshContactPoints();
}